

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_s256_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  size_t bit;
  size_t extraout_RDX;
  size_t bit_00;
  size_t bit_01;
  size_t bit_02;
  size_t bit_03;
  size_t extraout_RDX_00;
  long lVar2;
  word256 *palVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 local_c8 [32];
  undefined1 local_98 [32];
  
  uVar1 = v->w64[1];
  palVar3 = (word256 *)(uVar1 >> 0x22);
  local_98 = ZEXT1632(*(undefined1 (*) [16])c->w64);
  auVar4 = *(undefined1 (*) [32])A->w64;
  auVar5 = auVar4;
  mm256_compute_mask_2(palVar3,0,(size_t)A);
  local_98 = vpternlogq_avx512vl(auVar5,auVar4,local_98,0x6a);
  auVar4 = *(undefined1 (*) [32])A[1].w64;
  auVar5 = auVar4;
  mm256_compute_mask_2(palVar3,2,bit);
  local_c8 = vpand_avx2(auVar5,auVar4);
  palVar3 = (word256 *)(uVar1 >> 0x26);
  lVar2 = 0x40;
  bit_00 = extraout_RDX;
  while ((int)lVar2 != 0x1c0) {
    auVar4 = *(undefined1 (*) [32])((long)A->w64 + lVar2);
    auVar5 = auVar4;
    mm256_compute_mask_2(palVar3,0,bit_00);
    auVar5 = vandps_avx(auVar5,auVar4);
    auVar4 = *(undefined1 (*) [32])((long)A[1].w64 + lVar2);
    auVar6 = auVar4;
    mm256_compute_mask_2(palVar3,2,bit_01);
    auVar6 = vandps_avx(auVar6,auVar4);
    auVar4 = *(undefined1 (*) [32])((long)A[2].w64 + lVar2);
    auVar7 = auVar4;
    mm256_compute_mask_2(palVar3,4,bit_02);
    auVar4 = vpand_avx2(auVar7,auVar4);
    local_98 = vpternlogq_avx512vl(local_98,auVar4,auVar5,0x96);
    auVar4 = *(undefined1 (*) [32])((long)A[3].w64 + lVar2);
    auVar5 = auVar4;
    mm256_compute_mask_2(palVar3,6,bit_03);
    auVar4 = vpand_avx2(auVar5,auVar4);
    palVar3 = (word256 *)((ulong)palVar3 >> 8);
    lVar2 = lVar2 + 0x80;
    local_c8 = vpternlogq_avx512vl(local_c8,auVar4,auVar6,0x96);
    bit_00 = extraout_RDX_00;
  }
  auVar4 = *(undefined1 (*) [32])A[0xe].w64;
  auVar5 = auVar4;
  mm256_compute_mask_2(palVar3,0,bit_00);
  auVar4 = vpand_avx2(auVar5,auVar4);
  auVar4 = vpternlogq_avx512vl(local_98,auVar4,local_c8,0x96);
  *(undefined1 (*) [16])c->w64 = auVar4._0_16_ ^ auVar4._16_16_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = vblock->w64[1] >> 34;

  word256 cval[2];
  cval[0] = mm256_xor_mask(_mm256_setr_m128i(mm128_load(cblock->w64), mm128_zero),
                           mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
  idx >>= 4;
  Ablock += 2;

  for (unsigned int i = 24; i; i -= 8, idx >>= 8, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
  }
  cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));

  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(cblock->w64, mm128_xor(_mm256_extractf128_si256(cval[0], 0),
                                     _mm256_extractf128_si256(cval[0], 1)));
}